

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reed_solomn_reconstruct.cpp
# Opt level: O0

vector<__int128,_std::allocator<__int128>_> * __thiscall
reed_solomn::poly_strip(reed_solomn *this,vector<__int128,_std::allocator<__int128>_> *A)

{
  size_type sVar1;
  reference pvVar2;
  vector<__int128,_std::allocator<__int128>_> *in_RDX;
  vector<__int128,_std::allocator<__int128>_> *in_RDI;
  int j;
  int i;
  vector<__int128,_std::allocator<__int128>_> *res;
  int local_24;
  int local_20;
  
  std::vector<__int128,_std::allocator<__int128>_>::vector
            ((vector<__int128,_std::allocator<__int128>_> *)0x13a8ff);
  sVar1 = std::vector<__int128,_std::allocator<__int128>_>::size(in_RDX);
  local_20 = (int)sVar1;
  do {
    local_20 = local_20 + -1;
    if (local_20 < 0) {
      return in_RDI;
    }
    pvVar2 = std::vector<__int128,_std::allocator<__int128>_>::operator[](in_RDX,(long)local_20);
  } while ((long)*pvVar2 == 0 && *(long *)((long)pvVar2 + 8) == 0);
  for (local_24 = 0; local_24 <= local_20; local_24 = local_24 + 1) {
    std::vector<__int128,_std::allocator<__int128>_>::operator[](in_RDX,(long)local_24);
    std::vector<__int128,_std::allocator<__int128>_>::push_back(in_RDX,(value_type *)in_RDI);
  }
  return in_RDI;
}

Assistant:

vector<ll128> reed_solomn::poly_strip(vector<ll128> A) {
    vector<ll128> res;
    for (int i = A.size()-1; i >=0 ; --i) {
        if (A[i] !=0) {
            for (int j = 0; j <= i; ++j) {
                res.push_back(A[j]);
            }
            break;
        }
    }
    return res;
}